

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_kernel.h
# Opt level: O2

void __thiscall
dlib::
array<dlib::member_function_pointer<void,_void,_void,_void>,_dlib::memory_manager_stateless_kernel_1<char>_>
::set_size(array<dlib::member_function_pointer<void,_void,_void,_void>,_dlib::memory_manager_stateless_kernel_1<char>_>
           *this,unsigned_long size)

{
  uint *puVar1;
  member_function_pointer<void,_void,_void,_void> *pmVar2;
  ostream *poVar3;
  fatal_error *this_00;
  string sStack_1b8;
  ostringstream dlib_o_out;
  uint auStack_180 [88];
  
  if (size <= this->max_array_size) {
    (*(this->super_enumerable<dlib::member_function_pointer<void,_void,_void,_void>_>).
      _vptr_enumerable[3])(this);
    this->array_size = size;
    pmVar2 = this->array_elements + (size - 1);
    if (size == 0) {
      pmVar2 = (member_function_pointer<void,_void,_void,_void> *)0x0;
    }
    this->last_pos = pmVar2;
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
  poVar3 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x184);
  std::operator<<(poVar3,".\n");
  poVar3 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
  poVar3 = std::operator<<(poVar3,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/gui_widgets/../gui_core/../threads/../array/array_kernel.h"
                          );
  std::operator<<(poVar3,".\n");
  poVar3 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
  poVar3 = std::operator<<(poVar3,
                           "void dlib::array<dlib::member_function_pointer<void, void, void, void>>::set_size(unsigned long) [T = dlib::member_function_pointer<void, void, void, void>, mem_manager = dlib::memory_manager_stateless_kernel_1<char>]"
                          );
  std::operator<<(poVar3,".\n\n");
  poVar3 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
  poVar3 = std::operator<<(poVar3,"( size <= this->max_size() )");
  std::operator<<(poVar3,".\n");
  puVar1 = (uint *)((long)auStack_180 + *(long *)(_dlib_o_out + -0x18));
  *puVar1 = *puVar1 | 1;
  poVar3 = std::operator<<((ostream *)&dlib_o_out,"\tvoid array::set_size");
  poVar3 = std::operator<<(poVar3,"\n\tsize must be <= max_size()");
  poVar3 = std::operator<<(poVar3,"\n\tsize: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,"\n\tmax size: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,"\n\tthis: ");
  poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
  std::operator<<(poVar3,"\n");
  this_00 = (fatal_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  fatal_error::fatal_error(this_00,EBROKEN_ASSERT,&sStack_1b8);
  __cxa_throw(this_00,&fatal_error::typeinfo,error::~error);
}

Assistant:

void array<T,mem_manager>::
    set_size (
        unsigned long size
    )
    {
        // make sure requires clause is not broken
        DLIB_CASSERT(( size <= this->max_size() ),
            "\tvoid array::set_size"
            << "\n\tsize must be <= max_size()"
            << "\n\tsize: " << size 
            << "\n\tmax size: " << this->max_size()
            << "\n\tthis: " << this
            );

        reset();
        array_size = size;
        if (size > 0)
            last_pos = array_elements + size - 1;
        else
            last_pos = 0;
    }